

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManOperation(If_DsdMan_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  word *pwVar14;
  uint uVar15;
  uint uVar16;
  uchar *puVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uchar pPermNew [12];
  char pCanonPerm [12];
  int pBegEnd [12];
  int pChildren [12];
  undefined1 local_d4 [12];
  word *local_c8;
  ulong local_c0;
  uint local_b4;
  ulong local_b0;
  char local_a4 [12];
  uint local_98 [12];
  uint local_68 [14];
  
  uVar20 = (ulong)(uint)nLits;
  if (Type - 3U < 2) {
    uVar18 = 0;
    uVar4 = 0;
    uVar13 = 0;
    local_c8 = pTruth;
    if (0 < nLits) {
      uVar10 = 0;
      uVar13 = 0;
      uVar4 = 0;
      uVar18 = 0;
      puVar17 = pPerm;
      local_c0 = uVar20;
      do {
        if (Type == 4) {
          uVar8 = pLits[uVar10];
          if ((int)uVar8 < 0) goto LAB_0042478a;
          if ((uVar8 & 1) != 0) {
            pLits[uVar10] = uVar8 & 0x7ffffffe;
            uVar4 = uVar4 ^ 1;
          }
        }
        uVar8 = pLits[uVar10];
        if ((int)uVar8 < 0) goto LAB_0042476b;
        iVar6 = (p->vObjs).nSize;
        if (iVar6 <= (int)(uVar8 >> 1)) goto LAB_0042474c;
        ppvVar1 = (p->vObjs).pArray;
        pvVar2 = ppvVar1[uVar8 >> 1];
        iVar11 = (int)uVar13;
        if (((*(uint *)((long)pvVar2 + 4) & 7) == Type) && ((Type == 4 || ((uVar8 & 1) == 0)))) {
          if (0x7ffffff < *(uint *)((long)pvVar2 + 4)) {
            lVar7 = (long)iVar11;
            uVar13 = 0;
            do {
              uVar8 = *(uint *)((long)pvVar2 + uVar13 * 4 + 8);
              if (uVar8 == 0) break;
              if (Type != 3) {
                if ((int)uVar8 < 0) goto LAB_0042478a;
                if ((uVar8 & 1) != 0) {
                  __assert_fail("Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                                ,0x60c,
                                "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                               );
                }
              }
              local_68[lVar7 + uVar13] = uVar8;
              if ((int)uVar8 < 0) goto LAB_0042476b;
              if (iVar6 <= (int)(uVar8 >> 1)) goto LAB_0042474c;
              pvVar3 = ppvVar1[uVar8 >> 1];
              local_98[lVar7 + uVar13] =
                   (*(uint *)((long)pvVar3 + 4) >> 3 & 0x1f) + uVar18 | uVar18 << 0x10;
              uVar18 = uVar18 + (*(uint *)((long)pvVar3 + 4) >> 3 & 0x1f);
              uVar13 = uVar13 + 1;
            } while (uVar13 < *(uint *)((long)pvVar2 + 4) >> 0x1b);
            uVar13 = lVar7 + uVar13;
          }
        }
        else {
          uVar5 = If_DsdManPushInv(p,uVar8,puVar17);
          local_68[iVar11] = uVar5 ^ uVar8;
          uVar13 = (ulong)(iVar11 + 1);
          local_98[iVar11] = (*(uint *)((long)pvVar2 + 4) >> 3 & 0x1f) + uVar18 | uVar18 << 0x10;
          uVar18 = uVar18 + (*(uint *)((long)pvVar2 + 4) >> 3 & 0x1f);
        }
        puVar17 = puVar17 + (*(uint *)((long)pvVar2 + 4) >> 3 & 0x1f);
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_c0);
    }
    iVar6 = (int)uVar13;
    If_DsdObjSort(p,&p->vObjs,(int *)local_68,iVar6,(int *)local_98);
    uVar8 = 0;
    if (0 < iVar6) {
      uVar20 = 0;
      uVar8 = 0;
      do {
        uVar16 = local_98[uVar20] & 0xff;
        uVar5 = (int)local_98[uVar20] >> 0x10;
        if ((int)uVar5 < (int)uVar16) {
          memcpy(local_d4 + (int)uVar8,pPerm + (int)uVar5,(ulong)(~uVar5 + uVar16) + 1);
          lVar7 = 0;
          do {
            lVar7 = lVar7 + -1;
          } while ((long)(int)uVar5 - (ulong)uVar16 != lVar7);
          uVar8 = uVar8 - (int)lVar7;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != (uVar13 & 0xffffffff));
    }
    if (uVar8 != uVar18) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x61f,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    pTruth = local_c8;
    if (0 < (int)uVar18) {
      memcpy(pPerm,local_d4,(ulong)uVar18);
      pTruth = local_c8;
    }
    goto LAB_00424718;
  }
  if (Type == 6) {
    local_c8 = pTruth;
    uVar4 = Abc_TtCanonicize(pTruth,nLits,local_a4);
    local_c0 = CONCAT44(local_c0._4_4_,uVar4);
    uVar18 = If_DsdManComputeFirstArray(p,pLits,nLits,(int *)local_98);
    local_b0 = uVar20;
    if (nLits < 1) {
      uVar8 = 0;
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      uVar8 = 0;
      local_b4 = uVar18;
      do {
        uVar18 = pLits[local_a4[uVar13]];
        if ((int)uVar18 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if ((p->vObjs).nSize <= (int)(uVar18 >> 1)) goto LAB_0042474c;
        uVar16 = ((uint)local_c0 >> ((uint)uVar13 & 0x1f) & 1) != 0 ^ uVar18;
        pvVar2 = (p->vObjs).pArray[uVar18 >> 1];
        uVar18 = local_98[local_a4[uVar13]];
        uVar5 = If_DsdManPushInv(p,uVar16,pPerm + (int)uVar18);
        local_68[uVar13] = uVar5 ^ uVar16;
        uVar5 = *(uint *)((long)pvVar2 + 4) >> 3;
        uVar16 = uVar5 & 0x1f;
        if (uVar16 != 0) {
          memcpy(local_d4 + (int)uVar8,pPerm + (int)uVar18,(ulong)(uVar5 & 0x1f));
          uVar8 = uVar8 + uVar16;
        }
        uVar13 = uVar13 + 1;
        uVar18 = local_b4;
      } while (uVar20 != uVar13);
    }
    uVar20 = local_b0;
    pTruth = local_c8;
    iVar6 = (int)uVar13;
    if (uVar8 != uVar18) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x65c,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    if (0 < (int)uVar18) {
      memcpy(pPerm,local_d4,(ulong)uVar18);
    }
    iVar11 = p->nVars;
    iVar9 = (int)uVar20;
    if (iVar11 != iVar9) {
      if (iVar11 <= iVar9) {
        __assert_fail("nVarS < nVarB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x47d,"void Abc_TtStretch6(word *, int, int)");
      }
      uVar18 = 1 << ((char)uVar20 - 6U & 0x1f);
      if (iVar9 < 7) {
        uVar18 = 1;
      }
      uVar8 = 1 << ((char)iVar11 - 6U & 0x1f);
      if (iVar11 < 7) {
        uVar8 = 1;
      }
      if (uVar18 != uVar8) {
        if ((int)uVar8 <= (int)uVar18) {
          __assert_fail("step < nWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x482,"void Abc_TtStretch6(word *, int, int)");
        }
        if (0 < (int)uVar8) {
          lVar7 = 0;
          pwVar14 = pTruth;
          do {
            if (0 < (int)uVar18) {
              uVar20 = 0;
              do {
                pwVar14[uVar20] = pTruth[uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
            lVar7 = lVar7 + (int)uVar18;
            pwVar14 = pwVar14 + (int)uVar18;
          } while (lVar7 < (long)(ulong)uVar8);
        }
      }
    }
    uVar4 = (uint)((uVar4 >> (nLits & 0x1fU) & 1) != 0);
    goto LAB_00424718;
  }
  if (Type != 5) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x661,
                  "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)")
    ;
  }
  if (nLits != 3) {
    __assert_fail("nLits == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x626,
                  "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)")
    ;
  }
  lVar7 = 0;
  puVar17 = pPerm;
  do {
    uVar18 = pLits[lVar7];
    if ((int)uVar18 < 0) goto LAB_0042476b;
    if ((p->vObjs).nSize <= (int)(uVar18 >> 1)) goto LAB_0042474c;
    pvVar2 = (p->vObjs).pArray[uVar18 >> 1];
    uVar4 = If_DsdManPushInv(p,uVar18,puVar17);
    pLits[lVar7] = uVar4 ^ uVar18;
    puVar17 = puVar17 + (*(uint *)((long)pvVar2 + 4) >> 3 & 0x1f);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  iVar6 = If_DsdObjCompare(p,&p->vObjs,pLits[1],pLits[2]);
  if (iVar6 == 1) {
LAB_004242cc:
    uVar18 = *pLits;
    if ((int)uVar18 < 0) {
LAB_0042476b:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    iVar6 = (p->vObjs).nSize;
    if (iVar6 <= (int)(uVar18 >> 1)) {
LAB_0042474c:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar4 = pLits[1];
    if ((int)uVar4 < 0) goto LAB_0042476b;
    if (iVar6 <= (int)(uVar4 >> 1)) goto LAB_0042474c;
    uVar8 = pLits[2];
    if ((int)uVar8 < 0) goto LAB_0042476b;
    if (iVar6 <= (int)(uVar8 >> 1)) goto LAB_0042474c;
    ppvVar1 = (p->vObjs).pArray;
    uVar5 = *(uint *)((long)ppvVar1[uVar18 >> 1] + 4) >> 3;
    uVar16 = uVar5 & 0x1f;
    uVar15 = *(uint *)((long)ppvVar1[uVar4 >> 1] + 4) >> 3;
    uVar12 = *(uint *)((long)ppvVar1[uVar8 >> 1] + 4) >> 3;
    uVar19 = uVar12 & 0x1f;
    *pLits = uVar18 ^ 1;
    pLits[1] = uVar8;
    pLits[2] = uVar4;
    if (uVar16 != 0) {
      memcpy(local_d4,pPerm,(ulong)(uVar5 & 0x1f));
    }
    uVar18 = uVar15 & 0x1f;
    if (uVar19 != 0) {
      memcpy(local_d4 + uVar16,pPerm + (uVar18 + uVar16),(ulong)(uVar12 & 0x1f));
    }
    if (uVar18 != 0) {
      memcpy(local_d4 + (uVar16 + uVar19),pPerm + uVar16,(ulong)(uVar15 & 0x1f));
    }
    if (uVar18 + uVar16 != 0 || uVar19 != 0) {
      memcpy(pPerm,local_d4,(ulong)((uVar19 + uVar18 + uVar16) - 1) + 1);
    }
  }
  else if (iVar6 == 0) {
    if (*pLits < 0) goto LAB_0042478a;
    if ((*pLits & 1U) != 0) goto LAB_004242cc;
  }
  uVar18 = pLits[1];
  if ((int)uVar18 < 0) {
LAB_0042478a:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  uVar4 = 0;
  if ((uVar18 & 1) != 0) {
    pLits[1] = uVar18 & 0x7ffffffe;
    if (pLits[2] < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    pLits[2] = pLits[2] ^ 1;
    uVar4 = 1;
  }
  lVar7 = 0;
  do {
    uVar18 = pLits[lVar7];
    if ((int)uVar18 < 0) goto LAB_0042476b;
    if ((p->vObjs).nSize <= (int)(uVar18 >> 1)) goto LAB_0042474c;
    pvVar2 = (p->vObjs).pArray[uVar18 >> 1];
    uVar8 = If_DsdManPushInv(p,uVar18,pPerm);
    local_68[lVar7] = uVar8 ^ uVar18;
    lVar7 = lVar7 + 1;
    pPerm = pPerm + (*(uint *)((long)pvVar2 + 4) >> 3 & 0x1f);
  } while (lVar7 != 3);
  iVar6 = 3;
LAB_00424718:
  iVar6 = If_DsdObjFindOrAdd(p,Type,(int *)local_68,iVar6,pTruth);
  if (iVar6 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  return uVar4 + iVar6 * 2;
}

Assistant:

int If_DsdManOperation( If_DsdMan_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    If_DsdObj_t * pObj, * pFanin;
    unsigned char pPermNew[DAU_MAX_VAR], * pPermStart = pPerm;
    int nChildren = 0, pChildren[DAU_MAX_VAR], pBegEnd[DAU_MAX_VAR];
    int i, k, j, Id, iFanin, fCompl = 0, nSSize = 0;
    if ( Type == IF_DSD_AND || Type == IF_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            if ( Type == IF_DSD_XOR && Abc_LitIsCompl(pLits[k]) )
            {
                pLits[k] = Abc_LitNot(pLits[k]);
                fCompl ^= 1;
            }
            pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            if ( Type == If_DsdObjType(pObj) && (Type == IF_DSD_XOR || !Abc_LitIsCompl(pLits[k])) )
            {
                If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
                {
                    assert( Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin) );
                    pChildren[nChildren] = iFanin;
                    pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdVecLitSuppSize(&p->vObjs, iFanin));
                    nSSize += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
                }
            }
            else
            {
                pChildren[nChildren] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
                pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdObjSuppSize(pObj));
                nSSize += If_DsdObjSuppSize(pObj);
            }
            pPermStart += If_DsdObjSuppSize(pObj);
        }
        If_DsdObjSort( p, &p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPermNew[j++] = pPerm[k];
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
    }
    else if ( Type == IF_DSD_MUX )
    {
        int RetValue;
        assert( nLits == 3 );
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pLits[k] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
        RetValue = If_DsdObjCompare( p, &p->vObjs, pLits[1], pLits[2] );
        if ( RetValue == 1 || (RetValue == 0 && Abc_LitIsCompl(pLits[0])) )
        {
            int nSupp0 = If_DsdVecLitSuppSize( &p->vObjs, pLits[0] );
            int nSupp1 = If_DsdVecLitSuppSize( &p->vObjs, pLits[1] );
            int nSupp2 = If_DsdVecLitSuppSize( &p->vObjs, pLits[2] );
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
            for ( j = k = 0; k < nSupp0; k++ )
                pPermNew[j++] = pPerm[k];
            for ( k = 0; k < nSupp2; k++ )
                pPermNew[j++] = pPerm[nSupp0 + nSupp1 + k];
            for ( k = 0; k < nSupp1; k++ )
                pPermNew[j++] = pPerm[nSupp0 + k];
            for ( j = 0; j < nSupp0 + nSupp1 + nSupp2; j++ )
                pPerm[j] = pPermNew[j];
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        pPermStart = pPerm;
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pChildren[nChildren++] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
    }
    else if ( Type == IF_DSD_PRIME )
    {
        char pCanonPerm[DAU_MAX_VAR];
        int i, uCanonPhase, pFirsts[DAU_MAX_VAR];
        uCanonPhase = Abc_TtCanonicize( pTruth, nLits, pCanonPerm );
        fCompl = ((uCanonPhase >> nLits) & 1);
        nSSize = If_DsdManComputeFirstArray( p, pLits, nLits, pFirsts );
        for ( j = i = 0; i < nLits; i++ )
        {
            int iLitNew = Abc_LitNotCond( pLits[(int)pCanonPerm[i]], ((uCanonPhase>>i)&1) );
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLitNew) );
            pPermStart = pPerm + pFirsts[(int)pCanonPerm[i]];
            pChildren[nChildren++] = Abc_LitNotCond( iLitNew, If_DsdManPushInv(p, iLitNew, pPermStart) );
            for ( k = 0; k < (int)pFanin->nSupp; k++ )            
                pPermNew[j++] = pPermStart[k];
        }
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
        Abc_TtStretch6( pTruth, nLits, p->nVars );
    }
    else assert( 0 );
    // create new graph
    Id = If_DsdObjFindOrAdd( p, Type, pChildren, nChildren, pTruth );
    return Abc_Var2Lit( Id, fCompl );
}